

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O3

void p_str(parse *p)

{
  char *pcVar1;
  
  pcVar1 = p->next;
  if (pcVar1 < p->end) {
    do {
      p->next = pcVar1 + 1;
      ordinary(p,(int)*pcVar1);
      pcVar1 = p->next;
    } while (pcVar1 < p->end);
  }
  else {
    if (p->error == 0) {
      p->error = 0xe;
    }
    p->next = nuls;
    p->end = nuls;
  }
  return;
}

Assistant:

static void
p_str(p)
register struct parse *p;
{
	REQUIRE(MORE(), REG_EMPTY);
	while (MORE())
		ordinary(p, GETNEXT());
}